

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeColorMappingTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::anon_unknown_0::NativeColorMappingCase::executeForConfig
          (NativeColorMappingCase *this,EGLDisplay display,EGLConfig config)

{
  bool bVar1;
  NativeType NVar2;
  TestLog *pTVar3;
  NativeDisplay *pNVar4;
  bool bVar5;
  undefined8 uVar6;
  bool bVar7;
  EGLint EVar8;
  deUint32 dVar9;
  int iVar10;
  GLenum GVar11;
  deUint32 dVar12;
  Library *pLVar13;
  NativeWindowFactory *pNVar14;
  NativePixmapFactory *pNVar15;
  NotSupportedError *pNVar16;
  undefined4 extraout_var;
  NativeWindow *window;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  EGLSurface pvVar17;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TestError *this_00;
  Vec4 *pVVar18;
  long lVar19;
  UniqueSurface surface;
  UniqueContext context;
  ScopedLogSection logSection;
  string configIdStr;
  Vec4 colors [16];
  Functions gl;
  deUint32 local_1c14;
  allocator<char> local_1bea;
  allocator<char> local_1be9;
  string local_1be8;
  undefined1 local_1bc8 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ba0;
  ScopedLogSection local_1b80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b78;
  Vec4 local_1b58;
  undefined8 local_1b48;
  undefined1 *puStack_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 local_1b28;
  undefined1 *puStack_1b20;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined1 *puStack_1b00;
  undefined1 *local_1af8;
  undefined8 uStack_1af0;
  undefined1 *local_1ae8;
  undefined1 *puStack_1ae0;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  undefined1 *local_1a78;
  undefined8 uStack_1a70;
  undefined1 *local_1a68;
  undefined8 uStack_1a60;
  undefined1 local_1a58 [8];
  undefined4 local_1a50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a48 [6];
  ios_base local_19e8 [8];
  ios_base local_19e0 [272];
  glClearFunc local_18d0;
  glClearColorFunc local_1898;
  glGetErrorFunc local_1258;
  
  local_1b58.m_data[0] = 0.0;
  local_1b58.m_data[1] = 0.0;
  local_1b58.m_data[2] = 0.0;
  local_1b58.m_data[3] = 1.0;
  local_1b48 = 0;
  puStack_1b40 = &DAT_3f8000003f800000;
  local_1b38 = 0x3f80000000000000;
  uStack_1b30 = 0x3f80000000000000;
  local_1b28 = 0x3f80000000000000;
  puStack_1b20 = &DAT_3f8000003f800000;
  local_1b18 = 0x3f800000;
  uStack_1b10 = 0x3f80000000000000;
  local_1b08 = 0x3f800000;
  puStack_1b00 = &DAT_3f8000003f800000;
  local_1af8 = &DAT_3f8000003f800000;
  uStack_1af0 = 0x3f80000000000000;
  local_1ae8 = &DAT_3f8000003f800000;
  puStack_1ae0 = &DAT_3f8000003f800000;
  local_1ad8 = 0;
  uStack_1ad0 = 0x3f80000000000000;
  local_1ac8 = 0;
  uStack_1ac0 = 0x3f8000003f000000;
  local_1ab8 = 0x3f00000000000000;
  uStack_1ab0 = 0x3f80000000000000;
  local_1aa8 = 0x3f00000000000000;
  uStack_1aa0 = 0x3f8000003f000000;
  local_1a98 = 0x3f000000;
  uStack_1a90 = 0x3f80000000000000;
  local_1a88 = 0x3f000000;
  uStack_1a80 = 0x3f8000003f000000;
  local_1a78 = &DAT_3f0000003f000000;
  uStack_1a70 = 0x3f80000000000000;
  local_1a68 = &DAT_3f0000003f000000;
  uStack_1a60 = 0x3f8000003f000000;
  pLVar13 = EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  EVar8 = eglu::getConfigAttribInt(pLVar13,display,config,0x3028);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a58);
  std::ostream::operator<<((ostringstream *)local_1a58,EVar8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a58);
  std::ios_base::~ios_base(local_19e8);
  pTVar3 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1bc8,
                 "Config ID ",&local_1b78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a58,(char *)local_1bc8._0_8_,&local_1be9);
  std::operator+(&local_1ba0,"Config ID ",&local_1b78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1be8,local_1ba0._M_dataplus._M_p,&local_1bea);
  tcu::ScopedLogSection::ScopedLogSection(&local_1b80,pTVar3,(string *)local_1a58,&local_1be8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1be8._M_dataplus._M_p != &local_1be8.field_2) {
    operator_delete(local_1be8._M_dataplus._M_p,local_1be8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ba0._M_dataplus._M_p != &local_1ba0.field_2) {
    operator_delete(local_1ba0._M_dataplus._M_p,local_1ba0.field_2._M_allocated_capacity + 1);
  }
  if (local_1a58 != (undefined1  [8])local_1a48) {
    operator_delete((void *)local_1a58,local_1a48[0]._M_allocated_capacity + 1);
  }
  if (local_1bc8._0_8_ != (long)local_1bc8 + 0x10) {
    operator_delete((void *)local_1bc8._0_8_,local_1bc8._16_8_ + 1);
  }
  pTVar3 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  NVar2 = this->m_nativeType;
  local_1a58 = (undefined1  [8])pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a50,"EGL_RED_SIZE: ",0xe);
  EVar8 = eglu::getConfigAttribInt(pLVar13,display,config,0x3024);
  std::ostream::operator<<((ostringstream *)&local_1a50,EVar8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  local_1a58 = (undefined1  [8])pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a50,"EGL_GREEN_SIZE: ",0x10)
  ;
  EVar8 = eglu::getConfigAttribInt(pLVar13,display,config,0x3023);
  std::ostream::operator<<((ostringstream *)&local_1a50,EVar8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  local_1a58 = (undefined1  [8])pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a50,"EGL_BLUE_SIZE: ",0xf);
  EVar8 = eglu::getConfigAttribInt(pLVar13,display,config,0x3022);
  std::ostream::operator<<((ostringstream *)&local_1a50,EVar8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  local_1a58 = (undefined1  [8])pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a50,"EGL_ALPHA_SIZE: ",0x10)
  ;
  EVar8 = eglu::getConfigAttribInt(pLVar13,display,config,0x3021);
  std::ostream::operator<<((ostringstream *)&local_1a50,EVar8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  local_1a58 = (undefined1  [8])pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a50,"EGL_DEPTH_SIZE: ",0x10)
  ;
  EVar8 = eglu::getConfigAttribInt(pLVar13,display,config,0x3025);
  std::ostream::operator<<((ostringstream *)&local_1a50,EVar8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  local_1a58 = (undefined1  [8])pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a50,"EGL_STENCIL_SIZE: ",0x12);
  EVar8 = eglu::getConfigAttribInt(pLVar13,display,config,0x3026);
  std::ostream::operator<<((ostringstream *)&local_1a50,EVar8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  local_1a58 = (undefined1  [8])pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a50,"EGL_SAMPLES: ",0xd);
  EVar8 = eglu::getConfigAttribInt(pLVar13,display,config,0x3031);
  std::ostream::operator<<((ostringstream *)&local_1a50,EVar8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  if (NVar2 == NATIVETYPE_WINDOW) {
    local_1a58 = (undefined1  [8])pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a50,"Waiting ",8);
    std::ostream::operator<<((ostringstream *)&local_1a50,0x50);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a50,
               "ms after eglSwapBuffers() and glFinish() for frame to become visible",0x44);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
    std::ios_base::~ios_base(local_19e0);
  }
  pNVar14 = eglu::selectNativeWindowFactory
                      (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                       m_nativeDisplayFactory,
                       ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx)->m_cmdLine);
  if ((pNVar14->m_capabilities & CAPABILITY_READ_SCREEN_PIXELS) == 0) {
    pNVar16 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar16,"Native window doesn\'t support readPixels()",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
               ,0x1e8);
    __cxa_throw(pNVar16,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pNVar15 = eglu::selectNativePixmapFactory
                      (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                       m_nativeDisplayFactory,
                       ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx)->m_cmdLine);
  if (this->m_nativeType == NATIVETYPE_PBUFFER_COPY_TO_PIXMAP) {
    if ((~*(uint *)(pNVar15 + 0x48) & 5) != 0) {
      pNVar16 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar16,"Native pixmap doesn\'t support readPixels() or legacy create surface",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                 ,0x1ff);
      goto LAB_00e46728;
    }
  }
  else if ((this->m_nativeType == NATIVETYPE_PIXMAP) && (((byte)pNVar15[0x48] & 4) == 0)) {
    pNVar16 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar16,"Native pixmap doesn\'t support readPixels()",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
               ,0x1f9);
LAB_00e46728:
    __cxa_throw(pNVar16,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_1a58 = (undefined1  [8])0x200003098;
  local_1a50 = 0x3038;
  (**pLVar13->_vptr_Library)(pLVar13,0x30a0);
  dVar9 = (*pLVar13->_vptr_Library[0x1f])(pLVar13);
  eglu::checkError(dVar9,"bindAPI(EGL_OPENGL_ES_API)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                   ,0x4f);
  iVar10 = (*pLVar13->_vptr_Library[6])(pLVar13,display,config,0);
  dVar9 = (*pLVar13->_vptr_Library[0x1f])(pLVar13);
  eglu::checkError(dVar9,"eglCreateContext() failed",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                   ,0x52);
  if ((EGLContext)CONCAT44(extraout_var,iVar10) == (EGLContext)0x0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"context",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
               ,0x53);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  eglu::UniqueContext::UniqueContext
            ((UniqueContext *)&local_1ba0,pLVar13,display,(EGLContext)CONCAT44(extraout_var,iVar10))
  ;
  glw::Functions::Functions((Functions *)local_1a58);
  EglTestContext::initGLFunctions
            ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx,(Functions *)local_1a58,
             (ApiType)0x2);
  NVar2 = this->m_nativeType;
  if (NVar2 == NATIVETYPE_WINDOW) {
    local_1bc8._0_4_ = 0x80;
    local_1bc8._4_4_ = 0x80;
    local_1bc8._8_4_ = 1;
    iVar10 = (*(pNVar14->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                       (pNVar14,(((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                                m_nativeDisplay).
                                super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                                .m_data.ptr,display,config);
    window = (NativeWindow *)CONCAT44(extraout_var_03,iVar10);
    pTVar3 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
             ->m_log;
    pNVar4 = (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->m_nativeDisplay).
             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
             ptr;
    bVar1 = this->m_render;
    iVar10 = (*pNVar4->_vptr_NativeDisplay[2])(pNVar4);
    pLVar13 = (Library *)CONCAT44(extraout_var_04,iVar10);
    pvVar17 = eglu::createWindowSurface(pNVar4,window,display,config,(EGLAttrib *)0x0);
    eglu::UniqueSurface::UniqueSurface((UniqueSurface *)&local_1be8,pLVar13,display,pvVar17);
    tcu::TextureLevel::TextureLevel((TextureLevel *)local_1bc8);
    (*pLVar13->_vptr_Library[0x27])
              (pLVar13,display,local_1be8.field_2._M_allocated_capacity,
               local_1be8.field_2._M_allocated_capacity,local_1ba0.field_2._M_allocated_capacity);
    dVar9 = (*pLVar13->_vptr_Library[0x1f])(pLVar13);
    eglu::checkError(dVar9,"makeCurrent(display, *surface, *surface, context)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                     ,0x14d);
    dVar9 = 0;
    if (bVar1 != false) {
      dVar9 = createGLES2Program((Functions *)local_1a58,pTVar3);
    }
    bVar5 = true;
    lVar19 = 0;
    do {
      pVVar18 = (Vec4 *)((long)local_1b58.m_data + lVar19);
      if (bVar1 == false) {
        (*local_1898)(*(GLfloat *)((long)local_1b58.m_data + lVar19),
                      *(GLfloat *)((long)local_1b58.m_data + lVar19 + 4),
                      *(GLfloat *)((long)local_1b58.m_data + lVar19 + 8),
                      *(GLfloat *)((long)local_1b58.m_data + lVar19 + 0xc));
        (*local_18d0)(0x4000);
        GVar11 = (*local_1258)();
        glu::checkError(GVar11,"Color clear failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                        ,0xd8);
      }
      else {
        anon_unknown_0::render((Functions *)local_1a58,dVar9,pVVar18);
      }
      (*pLVar13->_vptr_Library[0x31])(pLVar13,display,local_1be8.field_2._M_allocated_capacity);
      dVar12 = (*pLVar13->_vptr_Library[0x1f])(pLVar13);
      eglu::checkError(dVar12,"swapBuffers(display, *surface)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                       ,0x159);
      (*pLVar13->_vptr_Library[0x36])(pLVar13);
      dVar12 = (*pLVar13->_vptr_Library[0x1f])(pLVar13);
      eglu::checkError(dVar12,"waitClient()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                       ,0x15a);
      deSleep(0x50);
      (*window->_vptr_NativeWindow[8])(window,local_1bc8);
      bVar7 = validate(pTVar3,pLVar13,display,config,(TextureLevel *)local_1bc8,pVVar18);
      if (!bVar7) {
        bVar5 = false;
      }
      lVar19 = lVar19 + 0x10;
    } while (lVar19 != 0x100);
    (*pLVar13->_vptr_Library[0x27])(pLVar13,display,0,0,0);
    dVar9 = (*pLVar13->_vptr_Library[0x1f])(pLVar13);
    eglu::checkError(dVar9,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                     ,0x162);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_1bc8);
    eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)&local_1be8);
    if (!bVar5) {
      tcu::TestContext::setTestResult
                ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Invalid color rendered");
    }
  }
  else if (NVar2 == NATIVETYPE_PIXMAP) {
    window = (NativeWindow *)
             (**(code **)(*(long *)pNVar15 + 0x20))
                       (pNVar15,(((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                                m_nativeDisplay).
                                super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                                .m_data.ptr,display,config,0,0x80,0x80);
    pTVar3 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
             ->m_log;
    pNVar4 = (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->m_nativeDisplay).
             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
             ptr;
    bVar1 = this->m_render;
    iVar10 = (*pNVar4->_vptr_NativeDisplay[2])(pNVar4);
    pLVar13 = (Library *)CONCAT44(extraout_var_02,iVar10);
    pvVar17 = eglu::createPixmapSurface
                        (pNVar4,(NativePixmap *)window,display,config,(EGLAttrib *)0x0);
    eglu::UniqueSurface::UniqueSurface((UniqueSurface *)&local_1be8,pLVar13,display,pvVar17);
    tcu::TextureLevel::TextureLevel((TextureLevel *)local_1bc8);
    (*pLVar13->_vptr_Library[0x27])
              (pLVar13,display,local_1be8.field_2._M_allocated_capacity,
               local_1be8.field_2._M_allocated_capacity,local_1ba0.field_2._M_allocated_capacity);
    dVar9 = (*pLVar13->_vptr_Library[0x1f])(pLVar13);
    eglu::checkError(dVar9,"makeCurrent(display, *surface, *surface, context)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                     ,0x178);
    local_1c14 = 0;
    if (bVar1 != false) {
      local_1c14 = createGLES2Program((Functions *)local_1a58,pTVar3);
    }
    bVar5 = true;
    lVar19 = 0;
    do {
      pVVar18 = (Vec4 *)((long)local_1b58.m_data + lVar19);
      if (bVar1 == false) {
        (*local_1898)(*(GLfloat *)((long)local_1b58.m_data + lVar19),
                      *(GLfloat *)((long)local_1b58.m_data + lVar19 + 4),
                      *(GLfloat *)((long)local_1b58.m_data + lVar19 + 8),
                      *(GLfloat *)((long)local_1b58.m_data + lVar19 + 0xc));
        (*local_18d0)(0x4000);
        GVar11 = (*local_1258)();
        glu::checkError(GVar11,"Color clear failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                        ,0xd8);
      }
      else {
        anon_unknown_0::render((Functions *)local_1a58,local_1c14,pVVar18);
      }
      (*pLVar13->_vptr_Library[0x36])(pLVar13);
      dVar9 = (*pLVar13->_vptr_Library[0x1f])(pLVar13);
      eglu::checkError(dVar9,"waitClient()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                       ,0x184);
      (*window->_vptr_NativeWindow[4])(window,(TextureLevel *)local_1bc8);
      bVar7 = validate(pTVar3,pLVar13,display,config,(TextureLevel *)local_1bc8,pVVar18);
      if (!bVar7) {
        bVar5 = false;
      }
      lVar19 = lVar19 + 0x10;
    } while (lVar19 != 0x100);
    (*pLVar13->_vptr_Library[0x27])(pLVar13,display,0,0,0);
    dVar9 = (*pLVar13->_vptr_Library[0x1f])(pLVar13);
    eglu::checkError(dVar9,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                     ,0x18b);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_1bc8);
    eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)&local_1be8);
    if (!bVar5) {
      tcu::TestContext::setTestResult
                ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Invalid color rendered");
    }
  }
  else {
    if (NVar2 != NATIVETYPE_PBUFFER_COPY_TO_PIXMAP) goto LAB_00e46629;
    window = (NativeWindow *)
             (**(code **)(*(long *)pNVar15 + 0x20))
                       (pNVar15,(((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                                m_nativeDisplay).
                                super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                                .m_data.ptr,display,config,0,0x80,0x80);
    pTVar3 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
             ->m_log;
    bVar1 = this->m_render;
    iVar10 = (*pLVar13->_vptr_Library[10])(pLVar13,display,config,0);
    eglu::UniqueSurface::UniqueSurface
              ((UniqueSurface *)&local_1be8,pLVar13,display,
               (EGLSurface)CONCAT44(extraout_var_00,iVar10));
    tcu::TextureLevel::TextureLevel((TextureLevel *)local_1bc8);
    (*pLVar13->_vptr_Library[0x27])
              (pLVar13,display,local_1be8.field_2._M_allocated_capacity,
               local_1be8.field_2._M_allocated_capacity,local_1ba0.field_2._M_allocated_capacity);
    dVar9 = (*pLVar13->_vptr_Library[0x1f])(pLVar13);
    eglu::checkError(dVar9,"makeCurrent(display, *surface, *surface, context)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                     ,0x1a0);
    dVar9 = 0;
    if (bVar1 != false) {
      dVar9 = createGLES2Program((Functions *)local_1a58,pTVar3);
    }
    bVar5 = true;
    lVar19 = 0;
    do {
      pVVar18 = (Vec4 *)((long)local_1b58.m_data + lVar19);
      if (bVar1 == false) {
        (*local_1898)(*(GLfloat *)((long)local_1b58.m_data + lVar19),
                      *(GLfloat *)((long)local_1b58.m_data + lVar19 + 4),
                      *(GLfloat *)((long)local_1b58.m_data + lVar19 + 8),
                      *(GLfloat *)((long)local_1b58.m_data + lVar19 + 0xc));
        (*local_18d0)(0x4000);
        GVar11 = (*local_1258)();
        glu::checkError(GVar11,"Color clear failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                        ,0xd8);
      }
      else {
        anon_unknown_0::render((Functions *)local_1a58,dVar9,pVVar18);
      }
      uVar6 = local_1be8.field_2._M_allocated_capacity;
      iVar10 = (*window->_vptr_NativeWindow[2])(window);
      (*pLVar13->_vptr_Library[5])(pLVar13,display,uVar6,CONCAT44(extraout_var_01,iVar10));
      dVar12 = (*pLVar13->_vptr_Library[0x1f])(pLVar13);
      eglu::checkError(dVar12,"copyBuffers(display, *surface, nativePixmap.getLegacyNative())",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                       ,0x1ac);
      (*pLVar13->_vptr_Library[0x36])(pLVar13);
      dVar12 = (*pLVar13->_vptr_Library[0x1f])(pLVar13);
      eglu::checkError(dVar12,"waitClient()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                       ,0x1ad);
      (*window->_vptr_NativeWindow[4])(window,local_1bc8);
      bVar7 = validate(pTVar3,pLVar13,display,config,(TextureLevel *)local_1bc8,pVVar18);
      if (!bVar7) {
        bVar5 = false;
      }
      lVar19 = lVar19 + 0x10;
    } while (lVar19 != 0x100);
    (*pLVar13->_vptr_Library[0x27])(pLVar13,display,0,0,0);
    dVar9 = (*pLVar13->_vptr_Library[0x1f])(pLVar13);
    eglu::checkError(dVar9,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                     ,0x1b4);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_1bc8);
    eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)&local_1be8);
    if (!bVar5) {
      tcu::TestContext::setTestResult
                ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Invalid color rendered");
    }
  }
  (*window->_vptr_NativeWindow[1])(window);
LAB_00e46629:
  eglu::UniqueContext::~UniqueContext((UniqueContext *)&local_1ba0);
  tcu::TestLog::endSection(local_1b80.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b78._M_dataplus._M_p != &local_1b78.field_2) {
    operator_delete(local_1b78._M_dataplus._M_p,local_1b78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void NativeColorMappingCase::executeForConfig (EGLDisplay display, EGLConfig config)
{
	const int width		= 128;
	const int height	= 128;

	const tcu::Vec4 colors[] =
	{
		tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f),
		tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 1.0f, 1.0f, 1.0f),
		tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(1.0f, 0.0f, 1.0f, 1.0f),
		tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f),
		tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),

		tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 0.0f, 0.5f, 1.0f),
		tcu::Vec4(0.0f, 0.5f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 0.5f, 0.5f, 1.0f),
		tcu::Vec4(0.5f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(0.5f, 0.0f, 0.5f, 1.0f),
		tcu::Vec4(0.5f, 0.5f, 0.0f, 1.0f),
		tcu::Vec4(0.5f, 0.5f, 0.5f, 1.0f)
	};

	const Library&						egl				= m_eglTestCtx.getLibrary();
	const string						configIdStr		(de::toString(eglu::getConfigAttribInt(egl, display, config, EGL_CONFIG_ID)));
	tcu::ScopedLogSection				logSection		(m_testCtx.getLog(), ("Config ID " + configIdStr).c_str(), ("Config ID " + configIdStr).c_str());
	const int							waitFrames		= 5;
	const eglu::NativeWindowFactory*	windowFactory;
	const eglu::NativePixmapFactory*	pixmapFactory;

	logConfigInfo(m_testCtx.getLog(), egl, display, config, m_nativeType, waitFrames);

	try
	{
		windowFactory = &eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

		if ((windowFactory->getCapabilities() & eglu::NativeWindow::CAPABILITY_READ_SCREEN_PIXELS) == 0)
			TCU_THROW(NotSupportedError, "Native window doesn't support readPixels()");
	}
	catch (const tcu::NotSupportedError&)
	{
		if (m_nativeType == NATIVETYPE_WINDOW)
			throw;
		else
			windowFactory = DE_NULL;
	}

	try
	{
		pixmapFactory = &eglu::selectNativePixmapFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

		if (m_nativeType == NATIVETYPE_PIXMAP)
		{
			if ((pixmapFactory->getCapabilities() & eglu::NativePixmap::CAPABILITY_READ_PIXELS) == 0)
				TCU_THROW(NotSupportedError, "Native pixmap doesn't support readPixels()");
		}
		else if (m_nativeType == NATIVETYPE_PBUFFER_COPY_TO_PIXMAP)
		{
			if ((pixmapFactory->getCapabilities() & eglu::NativePixmap::CAPABILITY_READ_PIXELS) == 0 ||
				(pixmapFactory->getCapabilities() & eglu::NativePixmap::CAPABILITY_CREATE_SURFACE_LEGACY) == 0)
				TCU_THROW(NotSupportedError, "Native pixmap doesn't support readPixels() or legacy create surface");
		}
	}
	catch (const tcu::NotSupportedError&)
	{
		if (m_nativeType == NATIVETYPE_PIXMAP || m_nativeType == NATIVETYPE_PBUFFER_COPY_TO_PIXMAP)
			throw;
		else
			pixmapFactory = DE_NULL;
	}

	DE_ASSERT(m_nativeType != NATIVETYPE_WINDOW || windowFactory);
	DE_ASSERT((m_nativeType != NATIVETYPE_PIXMAP && m_nativeType != NATIVETYPE_PBUFFER_COPY_TO_PIXMAP) || pixmapFactory);

	eglu::UniqueContext		context		(egl, display, createGLES2Context(egl, display, config));
	glw::Functions			gl;

	m_eglTestCtx.initGLFunctions(&gl, glu::ApiType::es(2,0));

	switch (m_nativeType)
	{
		case NATIVETYPE_WINDOW:
		{
			de::UniquePtr<eglu::NativeWindow>	nativeWindow	(windowFactory->createWindow(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, eglu::WindowParams(width, height, eglu::WindowParams::VISIBILITY_VISIBLE)));

			if (!testNativeWindow(m_testCtx.getLog(), m_eglTestCtx.getNativeDisplay(), *nativeWindow, display, *context, config, gl, m_render, waitFrames, DE_LENGTH_OF_ARRAY(colors), colors))
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color rendered");
			break;
		}

		case NATIVETYPE_PIXMAP:
		{
			de::UniquePtr<eglu::NativePixmap> nativePixmap		(pixmapFactory->createPixmap(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, width, height));

			if (!testNativePixmap(m_testCtx.getLog(), m_eglTestCtx.getNativeDisplay(), *nativePixmap, display, *context, config, gl, m_render, DE_LENGTH_OF_ARRAY(colors), colors))
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color rendered");
			break;
		}

		case NATIVETYPE_PBUFFER_COPY_TO_PIXMAP:
		{
			de::UniquePtr<eglu::NativePixmap> nativePixmap		(pixmapFactory->createPixmap(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, width, height));

			if (!testNativePixmapCopy(m_testCtx.getLog(), egl, *nativePixmap, display, *context, config, gl, m_render, DE_LENGTH_OF_ARRAY(colors), colors))
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color rendered");
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}
}